

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elimination_ordering.cpp
# Opt level: O0

void indigox::algorithm::RandomOrder(PermutableGraph_p *G,ElimOrder *order)

{
  bool bVar1;
  vector<void_*,_std::allocator<void_*>_> *in_RSI;
  mt19937 ran;
  random_device rd;
  PermVertIterPair vs;
  vector<void_*,_std::allocator<void_*>_> *in_stack_ffffffffffffd888;
  _List_iterator<void_*> *in_stack_ffffffffffffd890;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this;
  undefined4 in_stack_ffffffffffffd898;
  undefined4 in_stack_ffffffffffffd89c;
  vector<void_*,_std::allocator<void_*>_> *this_00;
  random_device *in_stack_ffffffffffffd8d0;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffd940;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
  in_stack_ffffffffffffd948;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
  in_stack_ffffffffffffd950;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13a8;
  VertIterPair local_20;
  vector<void_*,_std::allocator<void_*>_> *local_10;
  
  local_10 = in_RSI;
  std::vector<void_*,_std::allocator<void_*>_>::clear
            ((vector<void_*,_std::allocator<void_*>_> *)0x19a859);
  std::__shared_ptr_access<indigox::PermutableGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<indigox::PermutableGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x19a863);
  local_20 = utils::
             Graph<indigox::PermVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
             ::GetVertices((Graph<indigox::PermVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
                            *)0x19a86b);
  while( true ) {
    bVar1 = std::operator!=(&local_20.first,&local_20.second);
    if (!bVar1) break;
    this_00 = local_10;
    std::_List_iterator<void_*>::operator*(in_stack_ffffffffffffd890);
    std::vector<void_*,_std::allocator<void_*>_>::push_back
              (this_00,(value_type *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
    std::_List_iterator<void_*>::operator++(&local_20.first);
  }
  this = &local_13a8;
  std::random_device::random_device(in_stack_ffffffffffffd8d0);
  std::random_device::operator()((random_device *)0x19a8ec);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(this,(result_type)in_stack_ffffffffffffd888);
  std::vector<void_*,_std::allocator<void_*>_>::begin(in_stack_ffffffffffffd888);
  std::vector<void_*,_std::allocator<void_*>_>::end(in_stack_ffffffffffffd888);
  std::
  shuffle<__gnu_cxx::__normal_iterator<void**,std::vector<void*,std::allocator<void*>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            (in_stack_ffffffffffffd950,in_stack_ffffffffffffd948,in_stack_ffffffffffffd940);
  std::random_device::~random_device((random_device *)0x19a94d);
  return;
}

Assistant:

void RandomOrder(PermutableGraph_p G, ElimOrder& order) {
      order.clear();
      
      for (PermVertIterPair vs = G->GetVertices(); vs.first != vs.second; ++vs.first) {
        order.push_back(*vs.first);
      }
      
      std::random_device rd;
      std::mt19937 ran(rd());
      
      std::shuffle(order.begin(), order.end(), ran);
      
    }